

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleJitProfilingHelpers.cpp
# Opt level: O0

void Js::SimpleJitHelpers::ProfileCall
               (void *framePtr,ProfileId profileId,InlineCacheIndex inlineCacheIndex,Var retval,
               Var callee,CallInfo info)

{
  bool bVar1;
  CallFlags CVar2;
  JavascriptCallStackLayout *pJVar3;
  FunctionBody *this;
  DynamicProfileInfo *this_00;
  undefined8 local_70;
  undefined8 local_68;
  bool ctor;
  FunctionInfo *calleeFunctionInfo;
  JavascriptFunction *calleeFunction;
  DynamicProfileInfo *dynamicProfileInfo;
  FunctionBody *callerFunctionBody;
  JavascriptFunction *caller;
  Var callee_local;
  Var retval_local;
  InlineCacheIndex inlineCacheIndex_local;
  ProfileId profileId_local;
  void *framePtr_local;
  CallInfo info_local;
  
  pJVar3 = JavascriptCallStackLayout::FromFramePointer(framePtr);
  this = JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)pJVar3);
  this_00 = FunctionBody::GetDynamicProfileInfo(this);
  bVar1 = VarIs<Js::JavascriptFunction>(callee);
  if (bVar1) {
    local_68 = VarTo<Js::JavascriptFunction>(callee);
  }
  else {
    local_68 = (JavascriptFunction *)0x0;
  }
  if (local_68 == (JavascriptFunction *)0x0) {
    local_70 = (FunctionInfo *)0x0;
  }
  else {
    local_70 = JavascriptFunction::GetFunctionInfo(local_68);
  }
  CVar2 = Js::operator&(info._3_4_ &
                        (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                         CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                        CallFlags_New),CallFlags_New);
  bVar1 = operator!(CVar2);
  DynamicProfileInfo::RecordCallSiteInfo
            (this_00,this,profileId,local_70,local_68,info._0_4_ & 0xffffff,
             (bool)((bVar1 ^ 0xffU) & 1),inlineCacheIndex);
  CVar2 = Js::operator&(info._3_4_ &
                        (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                         CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                        CallFlags_New),CallFlags_Value);
  if (CVar2 != CallFlags_None) {
    DynamicProfileInfo::RecordReturnTypeOnCallSiteInfo(this_00,this,profileId,retval);
  }
  return;
}

Assistant:

void SimpleJitHelpers::ProfileCall(void* framePtr, ProfileId profileId, InlineCacheIndex inlineCacheIndex, Var retval, Var callee, CallInfo info)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(SimpleProfileCall);
        JavascriptFunction* caller = JavascriptCallStackLayout::FromFramePointer(framePtr)->functionObject;

        FunctionBody* callerFunctionBody = caller->GetFunctionBody();
        DynamicProfileInfo * dynamicProfileInfo = callerFunctionBody->GetDynamicProfileInfo();

        JavascriptFunction *const calleeFunction =
            VarIs<JavascriptFunction>(callee) ? VarTo<JavascriptFunction>(callee) : nullptr;
        FunctionInfo* calleeFunctionInfo = calleeFunction ? calleeFunction->GetFunctionInfo() : nullptr;

        auto const ctor = !!(info.Flags & CallFlags_New);
        dynamicProfileInfo->RecordCallSiteInfo(callerFunctionBody, profileId, calleeFunctionInfo, calleeFunction, info.Count, ctor, inlineCacheIndex);

        if (info.Flags & CallFlags_Value)
        {
            dynamicProfileInfo->RecordReturnTypeOnCallSiteInfo(callerFunctionBody, profileId, retval);
        }
        JIT_HELPER_END(SimpleProfileCall);
    }